

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O0

void __thiscall vera::Vbo::printInfo(Vbo *this)

{
  ostream *poVar1;
  void *pvVar2;
  Vbo *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Vertices  = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->m_nVertices);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Indices   = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->m_nIndices);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  if (this->m_vertexLayout != (VertexLayout *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Vertex Layout:");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    VertexLayout::printAttrib(this->m_vertexLayout);
  }
  return;
}

Assistant:

void Vbo::printInfo() {
    std::cout << "Vertices  = " << m_nVertices << std::endl;
    std::cout << "Indices   = " << m_nIndices << std::endl;
    if (m_vertexLayout) {
        std::cout << "Vertex Layout:" << std::endl;
        m_vertexLayout->printAttrib();
    }
}